

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::DetermineForwardDeclarations
          (MessageGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *fwd_decls)

{
  Descriptor *pDVar1;
  FieldGenerator *pFVar2;
  long lVar3;
  long lVar4;
  pointer ppMVar5;
  
  if ((*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x6b) == '\0') &&
     (pDVar1 = this->descriptor_, 0 < *(int *)(pDVar1 + 0x2c))) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pFVar2 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar1 + 0x30) + lVar3));
      (*pFVar2->_vptr_FieldGenerator[7])(pFVar2,fwd_decls);
      lVar4 = lVar4 + 1;
      pDVar1 = this->descriptor_;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(pDVar1 + 0x2c));
  }
  for (ppMVar5 = (this->nested_message_generators_).
                 super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar5 !=
      (this->nested_message_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppMVar5 = ppMVar5 + 1) {
    DetermineForwardDeclarations(*ppMVar5,fwd_decls);
  }
  return;
}

Assistant:

void MessageGenerator::DetermineForwardDeclarations(set<string>* fwd_decls) {
  if (!IsMapEntryMessage(descriptor_)) {
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* fieldDescriptor = descriptor_->field(i);
      field_generators_.get(fieldDescriptor)
          .DetermineForwardDeclarations(fwd_decls);
    }
  }

  for (vector<MessageGenerator*>::iterator iter =
           nested_message_generators_.begin();
       iter != nested_message_generators_.end(); ++iter) {
    (*iter)->DetermineForwardDeclarations(fwd_decls);
  }
}